

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O2

void __thiscall
cmCTestGlobalVC::DoRevision
          (cmCTestGlobalVC *this,Revision *revision,
          vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *changes)

{
  cmCTest *this_00;
  _List_node_base *p_Var1;
  __type _Var2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
  *this_01;
  mapped_type *pmVar6;
  Revision *pRVar7;
  pointer pCVar8;
  allocator local_209;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> *local_208;
  Revision *local_200;
  Revision *local_1f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
  *local_1f0;
  string name;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  char *pcVar5;
  
  local_208 = changes;
  _Var2 = std::operator==(&revision->Rev,&this->OldRevision);
  if (_Var2) {
    cmCTestVC::Revision::operator=(&this->PriorRev,revision);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,".");
  std::ostream::flush();
  this_00 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x32,name._M_dataplus._M_p,false);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::list<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>::push_back
            (&this->Revisions,revision);
  p_Var1 = (this->Revisions).
           super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>._M_impl.
           _M_node.super__List_node_base._M_prev;
  poVar4 = std::operator<<((this->super_cmCTestVC).Log,"Found revision ");
  local_1f8 = (Revision *)(p_Var1 + 1);
  poVar4 = std::operator<<(poVar4,(string *)(p_Var1 + 1));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"  author = ");
  poVar4 = std::operator<<(poVar4,(string *)(p_Var1 + 5));
  poVar4 = std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<(poVar4,"  date = ");
  poVar4 = std::operator<<(poVar4,(string *)(p_Var1 + 3));
  std::operator<<(poVar4,"\n");
  local_1f0 = &this->Dirs;
  local_200 = &this->PriorRev;
  for (pCVar8 = (local_208->
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pCVar8 != (local_208->
                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                )._M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
    iVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[7])(this,&pCVar8->Path);
    pcVar5 = (char *)CONCAT44(extraout_var,iVar3);
    if (pcVar5 != (char *)0x0) {
      std::__cxx11::string::string((string *)&name,pcVar5,(allocator *)&local_1c8);
      cmsys::SystemTools::GetFilenamePath((string *)&cmCTestLog_msg,&name);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::string((string *)&local_1c8,pcVar5,&local_209);
      cmsys::SystemTools::GetFilenameName(&name,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      this_01 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGlobalVC::Directory>_>_>
                 ::operator[](local_1f0,(string *)&cmCTestLog_msg)->
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
      ;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
               ::operator[](this_01,&name);
      pRVar7 = pmVar6->Rev;
      if (pmVar6->Rev == (Revision *)0x0) {
        pRVar7 = local_200;
      }
      pmVar6->PriorRev = pRVar7;
      pmVar6->Rev = local_1f8;
      poVar4 = std::operator<<((this->super_cmCTestVC).Log,"  ");
      poVar4 = std::operator<<(poVar4,pCVar8->Action);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," ");
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  return;
}

Assistant:

void cmCTestGlobalVC::DoRevision(Revision const& revision,
                                 std::vector<Change> const& changes)
{
  // Ignore changes in the old revision.
  if(revision.Rev == this->OldRevision)
    {
    this->PriorRev = revision;
    return;
    }

  // Indicate we found a revision.
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Store the revision.
  this->Revisions.push_back(revision);

  // Report this revision.
  Revision const& rev = this->Revisions.back();
  this->Log << "Found revision " << rev.Rev << "\n"
            << "  author = " << rev.Author << "\n"
            << "  date = " << rev.Date << "\n";

  // Update information about revisions of the changed files.
  for(std::vector<Change>::const_iterator ci = changes.begin();
      ci != changes.end(); ++ci)
    {
    if(const char* local = this->LocalPath(ci->Path))
      {
      std::string dir = cmSystemTools::GetFilenamePath(local);
      std::string name = cmSystemTools::GetFilenameName(local);
      File& file = this->Dirs[dir][name];
      file.PriorRev = file.Rev? file.Rev : &this->PriorRev;
      file.Rev = &rev;
      this->Log << "  " << ci->Action << " " << local << " " << "\n";
      }
    }
}